

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cc
# Opt level: O0

void sptk::world::anon_unknown_2::GetF0CandidatesAndScores
               (double *boundary_f0_list,int number_of_bands,double actual_fs,int y_length,
               double *temporal_positions,int f0_length,fft_complex *y_spectrum,int fft_size,
               double f0_floor,double f0_ceil,double **raw_f0_candidates,double **raw_f0_scores)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  int in_ESI;
  undefined8 in_RDI;
  int in_R8D;
  double *unaff_retaddr;
  double in_stack_00000008;
  double in_stack_00000010;
  int j;
  int i;
  double *f0_score;
  double *f0_candidate;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 in_stack_fffffffffffffff0;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_R8D;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)in_R8D;
  uVar3 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar3);
  for (local_5c = 0; local_5c < in_ESI; local_5c = local_5c + 1) {
    GetF0CandidateFromRawEvent
              (f0_ceil,(double)f0_candidate,(fft_complex *)f0_score,i,j,in_stack_00000010,
               in_stack_00000008,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
               (double *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),*y_spectrum);
    for (local_60 = 0; local_60 < in_R8D; local_60 = local_60 + 1) {
      *(double *)(*(long *)(CONCAT44(i,j) + (long)local_5c * 8) + (long)local_60 * 8) =
           *(double *)((long)pvVar5 + (long)local_60 * 8) /
           (*(double *)((long)pvVar4 + (long)local_60 * 8) + 1e-12);
      *(undefined8 *)(*(long *)((long)in_stack_00000010 + (long)local_5c * 8) + (long)local_60 * 8)
           = *(undefined8 *)((long)pvVar4 + (long)local_60 * 8);
    }
  }
  if (pvVar4 != (void *)0x0) {
    operator_delete__(pvVar4);
  }
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  return;
}

Assistant:

static void GetF0CandidatesAndScores(const double *boundary_f0_list,
    int number_of_bands, double actual_fs, int y_length,
    const double *temporal_positions, int f0_length,
    const fft_complex *y_spectrum, int fft_size, double f0_floor,
    double f0_ceil, double **raw_f0_candidates, double **raw_f0_scores) {
  double *f0_candidate = new double[f0_length];
  double *f0_score = new double[f0_length];

  // Calculation of the acoustics events (zero-crossing)
  for (int i = 0; i < number_of_bands; ++i) {
    GetF0CandidateFromRawEvent(boundary_f0_list[i], actual_fs, y_spectrum,
        y_length, fft_size, f0_floor, f0_ceil, temporal_positions, f0_length,
        f0_score, f0_candidate);
    for (int j = 0; j < f0_length; ++j) {
      // A way to avoid zero division
      raw_f0_scores[i][j] = f0_score[j] /
        (f0_candidate[j] + world::kMySafeGuardMinimum);
      raw_f0_candidates[i][j] = f0_candidate[j];
    }
  }

  delete[] f0_candidate;
  delete[] f0_score;
}